

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

void Dar_BalanceUniqify(Aig_Obj_t *pObj,Vec_Ptr_t *vNodes,int fExor)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int i;
  int iVar4;
  bool bVar5;
  
  Vec_PtrSort(vNodes,Dar_ObjCompareLits);
  iVar3 = 0;
  i = 0;
  do {
    iVar4 = i;
    if (vNodes->nSize <= iVar3) {
LAB_003e467f:
      Vec_PtrShrink(vNodes,iVar4);
      if (1 < vNodes->nSize) {
        pvVar1 = Vec_PtrEntry(vNodes,0);
        iVar3 = 1;
        while (iVar3 < vNodes->nSize) {
          pvVar2 = Vec_PtrEntry(vNodes,iVar3);
          iVar3 = iVar3 + 1;
          bVar5 = pvVar1 == pvVar2;
          pvVar1 = pvVar2;
          if (bVar5) {
            __assert_fail("pTemp != pTempNext",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                          ,0x5a,"void Dar_BalanceUniqify(Aig_Obj_t *, Vec_Ptr_t *, int)");
          }
        }
      }
      return;
    }
    pvVar1 = Vec_PtrEntry(vNodes,iVar3);
    iVar4 = iVar3 + 1;
    if (iVar4 == vNodes->nSize) {
      iVar4 = i + 1;
      Vec_PtrWriteEntry(vNodes,i,pvVar1);
      goto LAB_003e467f;
    }
    pvVar2 = Vec_PtrEntry(vNodes,iVar4);
    if ((fExor == 0) && (pvVar1 == (void *)((ulong)pvVar2 ^ 1))) {
      vNodes->nSize = 0;
      return;
    }
    if (pvVar1 == pvVar2) {
      if (fExor == 0) {
        iVar4 = iVar3;
      }
      iVar3 = iVar4 + 1;
    }
    else {
      Vec_PtrWriteEntry(vNodes,i,pvVar1);
      iVar3 = iVar4;
      i = i + 1;
    }
  } while( true );
}

Assistant:

void Dar_BalanceUniqify( Aig_Obj_t * pObj, Vec_Ptr_t * vNodes, int fExor )
{
    Aig_Obj_t * pTemp, * pTempNext;
    int i, k;
    // sort the nodes by their literal
    Vec_PtrSort( vNodes, (int (*)())Dar_ObjCompareLits );
    // remove duplicates
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, i )
    {
        if ( i + 1 == Vec_PtrSize(vNodes) )
        {
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
            break;
        }
        pTempNext = (Aig_Obj_t *)Vec_PtrEntry( vNodes, i+1 );
        if ( !fExor && pTemp == Aig_Not(pTempNext) ) // pos_lit & neg_lit = 0
        {
            Vec_PtrClear( vNodes );
            return;
        }
        if ( pTemp != pTempNext )  // save if different
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
        else if ( fExor ) // in case of XOR, remove identical
            i++;
    }
    Vec_PtrShrink( vNodes, k );
    if ( Vec_PtrSize(vNodes) < 2 )
        return;
    // check that there is no duplicates
    pTemp = (Aig_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pTempNext, i, 1 )
    {
        assert( pTemp != pTempNext );
        pTemp = pTempNext;
    }
}